

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O1

void * hashmap_get_with_hash(hashmap *map,void *key,uint64_t hash)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  void *unaff_R12;
  void *pvVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = map->mask & hash & 0xffffffffffff;
  do {
    lVar3 = map->bucketsz * uVar5;
    uVar1 = *(ulong *)((long)map->buckets + lVar3);
    if (uVar1 < 0x1000000000000) {
      bVar6 = false;
      unaff_R12 = (void *)0x0;
    }
    else {
      if ((uVar1 & 0xffffffffffff) == (hash & 0xffffffffffff)) {
        pvVar4 = (void *)((long)map->buckets + lVar3 + 8);
        if (map->compare == (_func_int_void_ptr_void_ptr_void_ptr *)0x0) {
          bVar6 = false;
        }
        else {
          iVar2 = (*map->compare)(key,pvVar4,map->udata);
          bVar6 = iVar2 != 0;
          if (bVar6) {
            pvVar4 = unaff_R12;
          }
        }
        unaff_R12 = pvVar4;
        if (!bVar6) {
          bVar6 = false;
          goto LAB_0012f039;
        }
      }
      uVar5 = uVar5 + 1 & map->mask;
      bVar6 = true;
    }
LAB_0012f039:
    if (!bVar6) {
      return unaff_R12;
    }
  } while( true );
}

Assistant:

const void *hashmap_get_with_hash(struct hashmap *map, const void *key, 
    uint64_t hash)
{
    hash = clip_hash(hash);
    size_t i = hash & map->mask;
    while(1) {
        struct bucket *bucket = bucket_at(map, i);
        if (!bucket->dib) return NULL;
        if (bucket->hash == hash) {
            void *bitem = bucket_item(bucket);
            if (!map->compare || map->compare(key, bitem, map->udata) == 0) {
                return bitem;
            }
        }
        i = (i + 1) & map->mask;
    }
}